

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  Geometry *pGVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong *puVar17;
  ulong uVar18;
  Scene *pSVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar39;
  float fVar45;
  float fVar46;
  undefined1 auVar40 [16];
  float fVar47;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar48;
  float fVar57;
  float fVar58;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar59;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar60;
  undefined1 auVar56 [64];
  float fVar61;
  float fVar66;
  float fVar67;
  undefined1 auVar62 [16];
  float fVar68;
  undefined1 auVar63 [16];
  float fVar69;
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  float fVar85;
  float fVar94;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar92;
  float fVar93;
  undefined1 auVar91 [64];
  float fVar95;
  undefined1 auVar96 [16];
  float fVar104;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar102;
  float fVar103;
  undefined1 auVar101 [64];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [64];
  float fVar108;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar109 [64];
  undefined1 auVar113 [64];
  float fVar114;
  undefined1 auVar115 [16];
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar116 [64];
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar121 [64];
  float fVar125;
  float fVar126;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar127 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_1559;
  undefined8 local_1558;
  float fStack_1550;
  float fStack_154c;
  int local_153c;
  undefined1 local_1538 [16];
  undefined1 local_1528 [16];
  undefined8 local_1518;
  float fStack_1510;
  float fStack_150c;
  RayQueryContext *local_1500;
  undefined1 local_14f8 [16];
  undefined1 local_14e8 [16];
  undefined1 local_14d8 [16];
  undefined1 local_14c8 [16];
  undefined1 local_14b8 [16];
  undefined1 local_14a8 [16];
  undefined1 local_1498 [16];
  long local_1480;
  undefined4 local_1478;
  undefined4 local_1474;
  undefined4 local_1470;
  undefined4 local_146c;
  undefined4 local_1468;
  undefined4 local_1464;
  uint local_1460;
  uint local_145c;
  uint local_1458;
  RTCFilterFunctionNArguments local_1448;
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [16];
  undefined1 *local_13b8;
  undefined1 local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  undefined1 local_12f8 [32];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar29 = ray->tfar;
    if (0.0 <= fVar29) {
      local_1500 = context;
      puVar17 = local_11d8 + 1;
      aVar2 = (ray->dir).field_0;
      auVar30 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar79._8_4_ = 0x7fffffff;
      auVar79._0_8_ = 0x7fffffff7fffffff;
      auVar79._12_4_ = 0x7fffffff;
      auVar79 = vandps_avx((undefined1  [16])aVar2,auVar79);
      auVar70._8_4_ = 0x219392ef;
      auVar70._0_8_ = 0x219392ef219392ef;
      auVar70._12_4_ = 0x219392ef;
      auVar79 = vcmpps_avx(auVar79,auVar70,1);
      auVar71._8_4_ = 0x3f800000;
      auVar71._0_8_ = 0x3f8000003f800000;
      auVar71._12_4_ = 0x3f800000;
      auVar70 = vdivps_avx(auVar71,(undefined1  [16])aVar2);
      auVar72._8_4_ = 0x5d5e0b6b;
      auVar72._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar72._12_4_ = 0x5d5e0b6b;
      auVar79 = vblendvps_avx(auVar70,auVar72,auVar79);
      auVar62._0_4_ = auVar79._0_4_ * 0.99999964;
      auVar62._4_4_ = auVar79._4_4_ * 0.99999964;
      auVar62._8_4_ = auVar79._8_4_ * 0.99999964;
      auVar62._12_4_ = auVar79._12_4_ * 0.99999964;
      uVar1 = *(undefined4 *)&(ray->org).field_0;
      local_11f8._4_4_ = uVar1;
      local_11f8._0_4_ = uVar1;
      local_11f8._8_4_ = uVar1;
      local_11f8._12_4_ = uVar1;
      local_11f8._16_4_ = uVar1;
      local_11f8._20_4_ = uVar1;
      local_11f8._24_4_ = uVar1;
      local_11f8._28_4_ = uVar1;
      auVar91 = ZEXT3264(local_11f8);
      uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1218._4_4_ = uVar1;
      local_1218._0_4_ = uVar1;
      local_1218._8_4_ = uVar1;
      local_1218._12_4_ = uVar1;
      local_1218._16_4_ = uVar1;
      local_1218._20_4_ = uVar1;
      local_1218._24_4_ = uVar1;
      local_1218._28_4_ = uVar1;
      auVar101 = ZEXT3264(local_1218);
      uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1238._4_4_ = uVar1;
      local_1238._0_4_ = uVar1;
      local_1238._8_4_ = uVar1;
      local_1238._12_4_ = uVar1;
      local_1238._16_4_ = uVar1;
      local_1238._20_4_ = uVar1;
      local_1238._24_4_ = uVar1;
      local_1238._28_4_ = uVar1;
      auVar107 = ZEXT3264(local_1238);
      auVar49._0_4_ = auVar79._0_4_ * 1.0000004;
      auVar49._4_4_ = auVar79._4_4_ * 1.0000004;
      auVar49._8_4_ = auVar79._8_4_ * 1.0000004;
      auVar49._12_4_ = auVar79._12_4_ * 1.0000004;
      auVar79 = vshufps_avx(auVar62,auVar62,0);
      local_1258._16_16_ = auVar79;
      local_1258._0_16_ = auVar79;
      auVar109 = ZEXT3264(local_1258);
      auVar79 = vmovshdup_avx(auVar62);
      auVar70 = vshufps_avx(auVar62,auVar62,0x55);
      local_1278._16_16_ = auVar70;
      local_1278._0_16_ = auVar70;
      auVar113 = ZEXT3264(local_1278);
      auVar70 = vshufpd_avx(auVar62,auVar62,1);
      auVar71 = vshufps_avx(auVar62,auVar62,0xaa);
      local_1298._16_16_ = auVar71;
      local_1298._0_16_ = auVar71;
      auVar116 = ZEXT3264(local_1298);
      auVar71 = vshufps_avx(auVar49,auVar49,0);
      local_12b8._16_16_ = auVar71;
      local_12b8._0_16_ = auVar71;
      auVar121 = ZEXT3264(local_12b8);
      uVar18 = (ulong)(auVar62._0_4_ < 0.0) << 5;
      auVar71 = vshufps_avx(auVar49,auVar49,0x55);
      local_12d8._16_16_ = auVar71;
      local_12d8._0_16_ = auVar71;
      auVar65 = ZEXT3264(local_12d8);
      auVar71 = vshufps_avx(auVar49,auVar49,0xaa);
      uVar20 = (ulong)(auVar79._0_4_ < 0.0) << 5 | 0x40;
      local_12f8._16_16_ = auVar71;
      local_12f8._0_16_ = auVar71;
      auVar56 = ZEXT3264(local_12f8);
      uVar15 = (ulong)(auVar70._0_4_ < 0.0) << 5 | 0x80;
      uVar21 = uVar18 ^ 0x20;
      auVar79 = vshufps_avx(auVar30,auVar30,0);
      local_1318._16_16_ = auVar79;
      local_1318._0_16_ = auVar79;
      auVar80 = ZEXT3264(local_1318);
      auVar79 = vshufps_avx(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29),0);
      local_1338._16_16_ = auVar79;
      local_1338._0_16_ = auVar79;
      auVar84 = ZEXT3264(local_1338);
      local_1418 = mm_lookupmask_ps._240_16_;
LAB_00e56c76:
      if (puVar17 != local_11d8) {
        uVar22 = puVar17[-1];
        puVar17 = puVar17 + -1;
        while ((uVar22 & 8) == 0) {
          auVar4 = vsubps_avx(*(undefined1 (*) [32])(uVar22 + 0x40 + uVar18),auVar91._0_32_);
          auVar5._4_4_ = auVar109._4_4_ * auVar4._4_4_;
          auVar5._0_4_ = auVar109._0_4_ * auVar4._0_4_;
          auVar5._8_4_ = auVar109._8_4_ * auVar4._8_4_;
          auVar5._12_4_ = auVar109._12_4_ * auVar4._12_4_;
          auVar5._16_4_ = auVar109._16_4_ * auVar4._16_4_;
          auVar5._20_4_ = auVar109._20_4_ * auVar4._20_4_;
          auVar5._24_4_ = auVar109._24_4_ * auVar4._24_4_;
          auVar5._28_4_ = auVar4._28_4_;
          auVar4 = vsubps_avx(*(undefined1 (*) [32])(uVar22 + 0x40 + uVar20),auVar101._0_32_);
          auVar6._4_4_ = auVar113._4_4_ * auVar4._4_4_;
          auVar6._0_4_ = auVar113._0_4_ * auVar4._0_4_;
          auVar6._8_4_ = auVar113._8_4_ * auVar4._8_4_;
          auVar6._12_4_ = auVar113._12_4_ * auVar4._12_4_;
          auVar6._16_4_ = auVar113._16_4_ * auVar4._16_4_;
          auVar6._20_4_ = auVar113._20_4_ * auVar4._20_4_;
          auVar6._24_4_ = auVar113._24_4_ * auVar4._24_4_;
          auVar6._28_4_ = auVar4._28_4_;
          auVar4 = vmaxps_avx(auVar5,auVar6);
          auVar5 = vsubps_avx(*(undefined1 (*) [32])(uVar22 + 0x40 + uVar15),auVar107._0_32_);
          auVar7._4_4_ = auVar116._4_4_ * auVar5._4_4_;
          auVar7._0_4_ = auVar116._0_4_ * auVar5._0_4_;
          auVar7._8_4_ = auVar116._8_4_ * auVar5._8_4_;
          auVar7._12_4_ = auVar116._12_4_ * auVar5._12_4_;
          auVar7._16_4_ = auVar116._16_4_ * auVar5._16_4_;
          auVar7._20_4_ = auVar116._20_4_ * auVar5._20_4_;
          auVar7._24_4_ = auVar116._24_4_ * auVar5._24_4_;
          auVar7._28_4_ = auVar5._28_4_;
          auVar5 = vmaxps_avx(auVar7,auVar80._0_32_);
          auVar4 = vmaxps_avx(auVar4,auVar5);
          auVar5 = vsubps_avx(*(undefined1 (*) [32])(uVar22 + 0x40 + uVar21),auVar91._0_32_);
          auVar8._4_4_ = auVar121._4_4_ * auVar5._4_4_;
          auVar8._0_4_ = auVar121._0_4_ * auVar5._0_4_;
          auVar8._8_4_ = auVar121._8_4_ * auVar5._8_4_;
          auVar8._12_4_ = auVar121._12_4_ * auVar5._12_4_;
          auVar8._16_4_ = auVar121._16_4_ * auVar5._16_4_;
          auVar8._20_4_ = auVar121._20_4_ * auVar5._20_4_;
          auVar8._24_4_ = auVar121._24_4_ * auVar5._24_4_;
          auVar8._28_4_ = auVar5._28_4_;
          auVar5 = vsubps_avx(*(undefined1 (*) [32])(uVar22 + 0x40 + (uVar20 ^ 0x20)),
                              auVar101._0_32_);
          auVar9._4_4_ = auVar65._4_4_ * auVar5._4_4_;
          auVar9._0_4_ = auVar65._0_4_ * auVar5._0_4_;
          auVar9._8_4_ = auVar65._8_4_ * auVar5._8_4_;
          auVar9._12_4_ = auVar65._12_4_ * auVar5._12_4_;
          auVar9._16_4_ = auVar65._16_4_ * auVar5._16_4_;
          auVar9._20_4_ = auVar65._20_4_ * auVar5._20_4_;
          auVar9._24_4_ = auVar65._24_4_ * auVar5._24_4_;
          auVar9._28_4_ = auVar5._28_4_;
          auVar5 = vminps_avx(auVar8,auVar9);
          auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar22 + 0x40 + (uVar15 ^ 0x20)),
                              auVar107._0_32_);
          auVar10._4_4_ = auVar56._4_4_ * auVar6._4_4_;
          auVar10._0_4_ = auVar56._0_4_ * auVar6._0_4_;
          auVar10._8_4_ = auVar56._8_4_ * auVar6._8_4_;
          auVar10._12_4_ = auVar56._12_4_ * auVar6._12_4_;
          auVar10._16_4_ = auVar56._16_4_ * auVar6._16_4_;
          auVar10._20_4_ = auVar56._20_4_ * auVar6._20_4_;
          auVar10._24_4_ = auVar56._24_4_ * auVar6._24_4_;
          auVar10._28_4_ = auVar6._28_4_;
          auVar6 = vminps_avx(auVar10,auVar84._0_32_);
          auVar5 = vminps_avx(auVar5,auVar6);
          auVar4 = vcmpps_avx(auVar4,auVar5,2);
          uVar11 = vmovmskps_avx(auVar4);
          if (uVar11 == 0) goto LAB_00e56c76;
          uVar12 = uVar22 & 0xfffffffffffffff0;
          lVar16 = 0;
          if ((byte)uVar11 != 0) {
            for (; ((byte)uVar11 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
            }
          }
          uVar22 = *(ulong *)(uVar12 + lVar16 * 8);
          uVar11 = (uVar11 & 0xff) - 1 & uVar11 & 0xff;
          uVar13 = (ulong)uVar11;
          if (uVar11 != 0) {
            do {
              *puVar17 = uVar22;
              puVar17 = puVar17 + 1;
              lVar16 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                }
              }
              uVar22 = *(ulong *)(uVar12 + lVar16 * 8);
              uVar13 = uVar13 - 1 & uVar13;
            } while (uVar13 != 0);
          }
        }
        lVar16 = (ulong)((uint)uVar22 & 0xf) - 8;
        uVar22 = uVar22 & 0xfffffffffffffff0;
        for (local_1480 = 0; local_1480 != lVar16; local_1480 = local_1480 + 1) {
          lVar14 = local_1480 * 0xb0;
          uVar1 = *(undefined4 *)&(ray->org).field_0;
          auVar23._4_4_ = uVar1;
          auVar23._0_4_ = uVar1;
          auVar23._8_4_ = uVar1;
          auVar23._12_4_ = uVar1;
          uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar40._4_4_ = uVar1;
          auVar40._0_4_ = uVar1;
          auVar40._8_4_ = uVar1;
          auVar40._12_4_ = uVar1;
          uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar50._4_4_ = uVar1;
          auVar50._0_4_ = uVar1;
          auVar50._8_4_ = uVar1;
          auVar50._12_4_ = uVar1;
          local_14e8 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + lVar14),auVar23);
          local_14f8 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x10 + lVar14),auVar40);
          local_1498 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + lVar14),auVar50);
          auVar79 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x30 + lVar14),auVar23);
          auVar70 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x40 + lVar14),auVar40);
          auVar30 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x50 + lVar14),auVar50);
          auVar71 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x60 + lVar14),auVar23);
          auVar49 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x70 + lVar14),auVar40);
          auVar62 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x80 + lVar14),auVar50);
          local_14a8 = vsubps_avx(auVar71,local_14e8);
          local_14b8 = vsubps_avx(auVar49,local_14f8);
          local_14c8 = vsubps_avx(auVar62,local_1498);
          fVar125 = local_14f8._0_4_;
          fVar29 = fVar125 + auVar49._0_4_;
          fVar128 = local_14f8._4_4_;
          fVar36 = fVar128 + auVar49._4_4_;
          fVar130 = local_14f8._8_4_;
          fVar37 = fVar130 + auVar49._8_4_;
          fVar132 = local_14f8._12_4_;
          fVar38 = fVar132 + auVar49._12_4_;
          fVar108 = local_1498._0_4_;
          fVar61 = fVar108 + auVar62._0_4_;
          fVar110 = local_1498._4_4_;
          fVar66 = fVar110 + auVar62._4_4_;
          fVar111 = local_1498._8_4_;
          fVar67 = fVar111 + auVar62._8_4_;
          fVar112 = local_1498._12_4_;
          fVar68 = fVar112 + auVar62._12_4_;
          fVar48 = local_14c8._0_4_;
          auVar96._0_4_ = fVar29 * fVar48;
          fVar58 = local_14c8._4_4_;
          auVar96._4_4_ = fVar36 * fVar58;
          fVar57 = local_14c8._8_4_;
          auVar96._8_4_ = fVar37 * fVar57;
          fVar60 = local_14c8._12_4_;
          auVar96._12_4_ = fVar38 * fVar60;
          fVar134 = local_14b8._0_4_;
          auVar105._0_4_ = fVar134 * fVar61;
          fVar137 = local_14b8._4_4_;
          auVar105._4_4_ = fVar137 * fVar66;
          fVar140 = local_14b8._8_4_;
          auVar105._8_4_ = fVar140 * fVar67;
          fVar143 = local_14b8._12_4_;
          auVar105._12_4_ = fVar143 * fVar68;
          auVar72 = vsubps_avx(auVar105,auVar96);
          fVar85 = local_14e8._0_4_;
          fVar95 = fVar85 + auVar71._0_4_;
          fVar92 = local_14e8._4_4_;
          fVar102 = fVar92 + auVar71._4_4_;
          fVar93 = local_14e8._8_4_;
          fVar103 = fVar93 + auVar71._8_4_;
          fVar94 = local_14e8._12_4_;
          fVar104 = fVar94 + auVar71._12_4_;
          fVar120 = local_14a8._0_4_;
          auVar63._0_4_ = fVar120 * fVar61;
          fVar122 = local_14a8._4_4_;
          auVar63._4_4_ = fVar122 * fVar66;
          fVar123 = local_14a8._8_4_;
          auVar63._8_4_ = fVar123 * fVar67;
          fVar124 = local_14a8._12_4_;
          auVar63._12_4_ = fVar124 * fVar68;
          auVar106._0_4_ = fVar95 * fVar48;
          auVar106._4_4_ = fVar102 * fVar58;
          auVar106._8_4_ = fVar103 * fVar57;
          auVar106._12_4_ = fVar104 * fVar60;
          auVar23 = vsubps_avx(auVar106,auVar63);
          auVar97._0_4_ = fVar95 * fVar134;
          auVar97._4_4_ = fVar102 * fVar137;
          auVar97._8_4_ = fVar103 * fVar140;
          auVar97._12_4_ = fVar104 * fVar143;
          auVar24._0_4_ = fVar120 * fVar29;
          auVar24._4_4_ = fVar122 * fVar36;
          auVar24._8_4_ = fVar123 * fVar37;
          auVar24._12_4_ = fVar124 * fVar38;
          auVar24 = vsubps_avx(auVar24,auVar97);
          fVar29 = (ray->dir).field_0.m128[2];
          local_1558._4_4_ = (ray->dir).field_0.m128[1];
          local_1518._4_4_ = (ray->dir).field_0.m128[0];
          local_1538._0_4_ =
               local_1518._4_4_ * auVar72._0_4_ +
               fVar29 * auVar24._0_4_ + local_1558._4_4_ * auVar23._0_4_;
          local_1538._4_4_ =
               local_1518._4_4_ * auVar72._4_4_ +
               fVar29 * auVar24._4_4_ + local_1558._4_4_ * auVar23._4_4_;
          local_1538._8_4_ =
               local_1518._4_4_ * auVar72._8_4_ +
               fVar29 * auVar24._8_4_ + local_1558._4_4_ * auVar23._8_4_;
          local_1538._12_4_ =
               local_1518._4_4_ * auVar72._12_4_ +
               fVar29 * auVar24._12_4_ + local_1558._4_4_ * auVar23._12_4_;
          local_14d8 = vsubps_avx(local_14f8,auVar70);
          local_13f8 = vsubps_avx(local_1498,auVar30);
          fVar66 = fVar125 + auVar70._0_4_;
          fVar67 = fVar128 + auVar70._4_4_;
          fVar68 = fVar130 + auVar70._8_4_;
          fVar95 = fVar132 + auVar70._12_4_;
          fVar102 = fVar108 + auVar30._0_4_;
          fVar103 = fVar110 + auVar30._4_4_;
          fVar104 = fVar111 + auVar30._8_4_;
          fVar69 = fVar112 + auVar30._12_4_;
          fVar36 = local_13f8._0_4_;
          auVar115._0_4_ = fVar66 * fVar36;
          fVar37 = local_13f8._4_4_;
          auVar115._4_4_ = fVar67 * fVar37;
          fVar38 = local_13f8._8_4_;
          auVar115._8_4_ = fVar68 * fVar38;
          fVar61 = local_13f8._12_4_;
          auVar115._12_4_ = fVar95 * fVar61;
          fVar135 = local_14d8._0_4_;
          auVar127._0_4_ = fVar135 * fVar102;
          fVar138 = local_14d8._4_4_;
          auVar127._4_4_ = fVar138 * fVar103;
          fVar141 = local_14d8._8_4_;
          auVar127._8_4_ = fVar141 * fVar104;
          fVar144 = local_14d8._12_4_;
          auVar127._12_4_ = fVar144 * fVar69;
          auVar72 = vsubps_avx(auVar127,auVar115);
          auVar23 = vsubps_avx(local_14e8,auVar79);
          fVar126 = auVar23._0_4_;
          auVar64._0_4_ = fVar126 * fVar102;
          fVar129 = auVar23._4_4_;
          auVar64._4_4_ = fVar129 * fVar103;
          fVar131 = auVar23._8_4_;
          auVar64._8_4_ = fVar131 * fVar104;
          fVar133 = auVar23._12_4_;
          auVar64._12_4_ = fVar133 * fVar69;
          fVar102 = fVar85 + auVar79._0_4_;
          fVar103 = fVar92 + auVar79._4_4_;
          fVar104 = fVar93 + auVar79._8_4_;
          fVar69 = fVar94 + auVar79._12_4_;
          auVar98._0_4_ = fVar102 * fVar36;
          auVar98._4_4_ = fVar103 * fVar37;
          auVar98._8_4_ = fVar104 * fVar38;
          auVar98._12_4_ = fVar69 * fVar61;
          auVar23 = vsubps_avx(auVar98,auVar64);
          auVar99._8_4_ = 0x7fffffff;
          auVar99._0_8_ = 0x7fffffff7fffffff;
          auVar99._12_4_ = 0x7fffffff;
          auVar86._0_4_ = fVar135 * fVar102;
          auVar86._4_4_ = fVar138 * fVar103;
          auVar86._8_4_ = fVar141 * fVar104;
          auVar86._12_4_ = fVar144 * fVar69;
          auVar25._0_4_ = fVar126 * fVar66;
          auVar25._4_4_ = fVar129 * fVar67;
          auVar25._8_4_ = fVar131 * fVar68;
          auVar25._12_4_ = fVar133 * fVar95;
          auVar24 = vsubps_avx(auVar25,auVar86);
          local_13d8._0_4_ =
               local_1518._4_4_ * auVar72._0_4_ +
               fVar29 * auVar24._0_4_ + local_1558._4_4_ * auVar23._0_4_;
          local_13d8._4_4_ =
               local_1518._4_4_ * auVar72._4_4_ +
               fVar29 * auVar24._4_4_ + local_1558._4_4_ * auVar23._4_4_;
          local_13d8._8_4_ =
               local_1518._4_4_ * auVar72._8_4_ +
               fVar29 * auVar24._8_4_ + local_1558._4_4_ * auVar23._8_4_;
          local_13d8._12_4_ =
               local_1518._4_4_ * auVar72._12_4_ +
               fVar29 * auVar24._12_4_ + local_1558._4_4_ * auVar23._12_4_;
          auVar72 = vsubps_avx(auVar79,auVar71);
          fVar102 = auVar79._0_4_ + auVar71._0_4_;
          fVar103 = auVar79._4_4_ + auVar71._4_4_;
          fVar104 = auVar79._8_4_ + auVar71._8_4_;
          fVar69 = auVar79._12_4_ + auVar71._12_4_;
          auVar79 = vsubps_avx(auVar70,auVar49);
          fVar39 = auVar70._0_4_ + auVar49._0_4_;
          fVar45 = auVar70._4_4_ + auVar49._4_4_;
          fVar46 = auVar70._8_4_ + auVar49._8_4_;
          fVar47 = auVar70._12_4_ + auVar49._12_4_;
          auVar70 = vsubps_avx(auVar30,auVar62);
          fVar67 = auVar30._0_4_ + auVar62._0_4_;
          fVar68 = auVar30._4_4_ + auVar62._4_4_;
          fVar95 = auVar30._8_4_ + auVar62._8_4_;
          fVar59 = auVar30._12_4_ + auVar62._12_4_;
          fVar136 = auVar70._0_4_;
          auVar73._0_4_ = fVar136 * fVar39;
          fVar139 = auVar70._4_4_;
          auVar73._4_4_ = fVar139 * fVar45;
          fVar142 = auVar70._8_4_;
          auVar73._8_4_ = fVar142 * fVar46;
          fVar145 = auVar70._12_4_;
          auVar73._12_4_ = fVar145 * fVar47;
          fVar114 = auVar79._0_4_;
          auVar87._0_4_ = fVar114 * fVar67;
          fVar117 = auVar79._4_4_;
          auVar87._4_4_ = fVar117 * fVar68;
          fVar118 = auVar79._8_4_;
          auVar87._8_4_ = fVar118 * fVar95;
          fVar119 = auVar79._12_4_;
          auVar87._12_4_ = fVar119 * fVar59;
          auVar79 = vsubps_avx(auVar87,auVar73);
          fVar66 = auVar72._0_4_;
          auVar51._0_4_ = fVar66 * fVar67;
          fVar67 = auVar72._4_4_;
          auVar51._4_4_ = fVar67 * fVar68;
          fVar68 = auVar72._8_4_;
          auVar51._8_4_ = fVar68 * fVar95;
          fVar95 = auVar72._12_4_;
          auVar51._12_4_ = fVar95 * fVar59;
          auVar88._0_4_ = fVar136 * fVar102;
          auVar88._4_4_ = fVar139 * fVar103;
          auVar88._8_4_ = fVar142 * fVar104;
          auVar88._12_4_ = fVar145 * fVar69;
          auVar70 = vsubps_avx(auVar88,auVar51);
          auVar30._0_4_ = fVar114 * fVar102;
          auVar30._4_4_ = fVar117 * fVar103;
          auVar30._8_4_ = fVar118 * fVar104;
          auVar30._12_4_ = fVar119 * fVar69;
          auVar41._0_4_ = fVar66 * fVar39;
          auVar41._4_4_ = fVar67 * fVar45;
          auVar41._8_4_ = fVar68 * fVar46;
          auVar41._12_4_ = fVar95 * fVar47;
          auVar30 = vsubps_avx(auVar41,auVar30);
          local_1558._0_4_ = local_1558._4_4_;
          fStack_1550 = local_1558._4_4_;
          fStack_154c = local_1558._4_4_;
          local_1518._0_4_ = local_1518._4_4_;
          fStack_1510 = local_1518._4_4_;
          fStack_150c = local_1518._4_4_;
          auVar31._0_4_ =
               local_1518._4_4_ * auVar79._0_4_ +
               fVar29 * auVar30._0_4_ + local_1558._4_4_ * auVar70._0_4_;
          auVar31._4_4_ =
               local_1518._4_4_ * auVar79._4_4_ +
               fVar29 * auVar30._4_4_ + local_1558._4_4_ * auVar70._4_4_;
          auVar31._8_4_ =
               local_1518._4_4_ * auVar79._8_4_ +
               fVar29 * auVar30._8_4_ + local_1558._4_4_ * auVar70._8_4_;
          auVar31._12_4_ =
               local_1518._4_4_ * auVar79._12_4_ +
               fVar29 * auVar30._12_4_ + local_1558._4_4_ * auVar70._12_4_;
          local_13c8._0_4_ = auVar31._0_4_ + local_1538._0_4_ + local_13d8._0_4_;
          local_13c8._4_4_ = auVar31._4_4_ + local_1538._4_4_ + local_13d8._4_4_;
          local_13c8._8_4_ = auVar31._8_4_ + local_1538._8_4_ + local_13d8._8_4_;
          local_13c8._12_4_ = auVar31._12_4_ + local_1538._12_4_ + local_13d8._12_4_;
          auVar79 = vminps_avx(local_1538,local_13d8);
          auVar79 = vminps_avx(auVar79,auVar31);
          local_1528 = vandps_avx(local_13c8,auVar99);
          auVar52._0_4_ = local_1528._0_4_ * 1.1920929e-07;
          auVar52._4_4_ = local_1528._4_4_ * 1.1920929e-07;
          auVar52._8_4_ = local_1528._8_4_ * 1.1920929e-07;
          auVar52._12_4_ = local_1528._12_4_ * 1.1920929e-07;
          uVar12 = CONCAT44(auVar52._4_4_,auVar52._0_4_);
          auVar74._0_8_ = uVar12 ^ 0x8000000080000000;
          auVar74._8_4_ = -auVar52._8_4_;
          auVar74._12_4_ = -auVar52._12_4_;
          auVar79 = vcmpps_avx(auVar79,auVar74,5);
          auVar70 = vmaxps_avx(local_1538,local_13d8);
          auVar70 = vmaxps_avx(auVar70,auVar31);
          auVar70 = vcmpps_avx(auVar70,auVar52,2);
          local_1408 = vorps_avx(auVar79,auVar70);
          auVar79 = local_1418 & local_1408;
          if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar79[0xf] < '\0') {
            auVar32._0_4_ = fVar135 * fVar48;
            auVar32._4_4_ = fVar138 * fVar58;
            auVar32._8_4_ = fVar141 * fVar57;
            auVar32._12_4_ = fVar144 * fVar60;
            auVar42._0_4_ = fVar134 * fVar36;
            auVar42._4_4_ = fVar137 * fVar37;
            auVar42._8_4_ = fVar140 * fVar38;
            auVar42._12_4_ = fVar143 * fVar61;
            auVar30 = vsubps_avx(auVar42,auVar32);
            auVar53._0_4_ = fVar114 * fVar36;
            auVar53._4_4_ = fVar117 * fVar37;
            auVar53._8_4_ = fVar118 * fVar38;
            auVar53._12_4_ = fVar119 * fVar61;
            auVar75._0_4_ = fVar135 * fVar136;
            auVar75._4_4_ = fVar138 * fVar139;
            auVar75._8_4_ = fVar141 * fVar142;
            auVar75._12_4_ = fVar144 * fVar145;
            auVar71 = vsubps_avx(auVar75,auVar53);
            auVar79 = vandps_avx(auVar99,auVar32);
            auVar70 = vandps_avx(auVar99,auVar53);
            auVar79 = vcmpps_avx(auVar79,auVar70,1);
            local_1368 = vblendvps_avx(auVar71,auVar30,auVar79);
            auVar43._0_4_ = fVar126 * fVar136;
            auVar43._4_4_ = fVar129 * fVar139;
            auVar43._8_4_ = fVar131 * fVar142;
            auVar43._12_4_ = fVar133 * fVar145;
            auVar54._0_4_ = fVar126 * fVar48;
            auVar54._4_4_ = fVar129 * fVar58;
            auVar54._8_4_ = fVar131 * fVar57;
            auVar54._12_4_ = fVar133 * fVar60;
            auVar76._0_4_ = fVar36 * fVar120;
            auVar76._4_4_ = fVar37 * fVar122;
            auVar76._8_4_ = fVar38 * fVar123;
            auVar76._12_4_ = fVar61 * fVar124;
            auVar30 = vsubps_avx(auVar54,auVar76);
            auVar81._0_4_ = fVar36 * fVar66;
            auVar81._4_4_ = fVar37 * fVar67;
            auVar81._8_4_ = fVar38 * fVar68;
            auVar81._12_4_ = fVar61 * fVar95;
            auVar71 = vsubps_avx(auVar81,auVar43);
            auVar79 = vandps_avx(auVar99,auVar76);
            auVar70 = vandps_avx(auVar99,auVar43);
            auVar79 = vcmpps_avx(auVar79,auVar70,1);
            local_1358 = vblendvps_avx(auVar71,auVar30,auVar79);
            auVar26._0_4_ = fVar135 * fVar66;
            auVar26._4_4_ = fVar138 * fVar67;
            auVar26._8_4_ = fVar141 * fVar68;
            auVar26._12_4_ = fVar144 * fVar95;
            auVar55._0_4_ = fVar135 * fVar120;
            auVar55._4_4_ = fVar138 * fVar122;
            auVar55._8_4_ = fVar141 * fVar123;
            auVar55._12_4_ = fVar144 * fVar124;
            auVar77._0_4_ = fVar126 * fVar134;
            auVar77._4_4_ = fVar129 * fVar137;
            auVar77._8_4_ = fVar131 * fVar140;
            auVar77._12_4_ = fVar133 * fVar143;
            auVar82._0_4_ = fVar126 * fVar114;
            auVar82._4_4_ = fVar129 * fVar117;
            auVar82._8_4_ = fVar131 * fVar118;
            auVar82._12_4_ = fVar133 * fVar119;
            auVar30 = vsubps_avx(auVar55,auVar77);
            auVar71 = vsubps_avx(auVar82,auVar26);
            auVar79 = vandps_avx(auVar99,auVar77);
            auVar70 = vandps_avx(auVar99,auVar26);
            auVar79 = vcmpps_avx(auVar79,auVar70,1);
            local_1348 = vblendvps_avx(auVar71,auVar30,auVar79);
            fVar48 = local_1368._0_4_ * local_1518._4_4_ +
                     fVar29 * local_1348._0_4_ + local_1358._0_4_ * local_1558._4_4_;
            fVar36 = local_1368._4_4_ * local_1518._4_4_ +
                     fVar29 * local_1348._4_4_ + local_1358._4_4_ * local_1558._4_4_;
            fVar58 = local_1368._8_4_ * local_1518._4_4_ +
                     fVar29 * local_1348._8_4_ + local_1358._8_4_ * local_1558._4_4_;
            fVar29 = local_1368._12_4_ * local_1518._4_4_ +
                     fVar29 * local_1348._12_4_ + local_1358._12_4_ * local_1558._4_4_;
            auVar78._0_4_ = fVar48 + fVar48;
            auVar78._4_4_ = fVar36 + fVar36;
            auVar78._8_4_ = fVar58 + fVar58;
            auVar78._12_4_ = fVar29 + fVar29;
            fVar37 = local_1368._0_4_ * fVar85 +
                     local_1348._0_4_ * fVar108 + local_1358._0_4_ * fVar125;
            fVar57 = local_1368._4_4_ * fVar92 +
                     local_1348._4_4_ * fVar110 + local_1358._4_4_ * fVar128;
            fVar38 = local_1368._8_4_ * fVar93 +
                     local_1348._8_4_ * fVar111 + local_1358._8_4_ * fVar130;
            fVar60 = local_1368._12_4_ * fVar94 +
                     local_1348._12_4_ * fVar112 + local_1358._12_4_ * fVar132;
            auVar79 = vrcpps_avx(auVar78);
            fVar29 = auVar79._0_4_;
            auVar89._0_4_ = auVar78._0_4_ * fVar29;
            fVar48 = auVar79._4_4_;
            auVar89._4_4_ = auVar78._4_4_ * fVar48;
            fVar36 = auVar79._8_4_;
            auVar89._8_4_ = auVar78._8_4_ * fVar36;
            fVar58 = auVar79._12_4_;
            auVar89._12_4_ = auVar78._12_4_ * fVar58;
            auVar100._8_4_ = 0x3f800000;
            auVar100._0_8_ = 0x3f8000003f800000;
            auVar100._12_4_ = 0x3f800000;
            auVar79 = vsubps_avx(auVar100,auVar89);
            local_1378._0_4_ = (fVar37 + fVar37) * (fVar29 + fVar29 * auVar79._0_4_);
            local_1378._4_4_ = (fVar57 + fVar57) * (fVar48 + fVar48 * auVar79._4_4_);
            local_1378._8_4_ = (fVar38 + fVar38) * (fVar36 + fVar36 * auVar79._8_4_);
            local_1378._12_4_ = (fVar60 + fVar60) * (fVar58 + fVar58 * auVar79._12_4_);
            uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
            auVar83._4_4_ = uVar1;
            auVar83._0_4_ = uVar1;
            auVar83._8_4_ = uVar1;
            auVar83._12_4_ = uVar1;
            auVar79 = vcmpps_avx(auVar83,local_1378,2);
            fVar29 = ray->tfar;
            auVar90._4_4_ = fVar29;
            auVar90._0_4_ = fVar29;
            auVar90._8_4_ = fVar29;
            auVar90._12_4_ = fVar29;
            auVar70 = vcmpps_avx(local_1378,auVar90,2);
            auVar79 = vandps_avx(auVar79,auVar70);
            auVar70 = vcmpps_avx(auVar78,_DAT_01f45a50,4);
            auVar79 = vandps_avx(auVar70,auVar79);
            auVar70 = vpand_avx(local_1408,local_1418);
            auVar79 = vpslld_avx(auVar79,0x1f);
            auVar79 = vpsrad_avx(auVar79,0x1f);
            local_13a8 = vpand_avx(auVar79,auVar70);
            uVar11 = vmovmskps_avx(local_13a8);
            if (uVar11 != 0) {
              local_1558 = lVar14 + uVar22;
              local_13e8 = local_1538;
              local_13b8 = &local_1559;
              auVar79 = vrcpps_avx(local_13c8);
              fVar29 = auVar79._0_4_;
              auVar33._0_4_ = local_13c8._0_4_ * fVar29;
              fVar48 = auVar79._4_4_;
              auVar33._4_4_ = local_13c8._4_4_ * fVar48;
              fVar36 = auVar79._8_4_;
              auVar33._8_4_ = local_13c8._8_4_ * fVar36;
              fVar58 = auVar79._12_4_;
              auVar33._12_4_ = local_13c8._12_4_ * fVar58;
              auVar44._8_4_ = 0x3f800000;
              auVar44._0_8_ = 0x3f8000003f800000;
              auVar44._12_4_ = 0x3f800000;
              auVar79 = vsubps_avx(auVar44,auVar33);
              auVar27._0_4_ = fVar29 + fVar29 * auVar79._0_4_;
              auVar27._4_4_ = fVar48 + fVar48 * auVar79._4_4_;
              auVar27._8_4_ = fVar36 + fVar36 * auVar79._8_4_;
              auVar27._12_4_ = fVar58 + fVar58 * auVar79._12_4_;
              auVar34._8_4_ = 0x219392ef;
              auVar34._0_8_ = 0x219392ef219392ef;
              auVar34._12_4_ = 0x219392ef;
              auVar79 = vcmpps_avx(local_1528,auVar34,5);
              auVar79 = vandps_avx(auVar79,auVar27);
              auVar35._0_4_ = local_1538._0_4_ * auVar79._0_4_;
              auVar35._4_4_ = local_1538._4_4_ * auVar79._4_4_;
              auVar35._8_4_ = local_1538._8_4_ * auVar79._8_4_;
              auVar35._12_4_ = local_1538._12_4_ * auVar79._12_4_;
              local_1398 = vminps_avx(auVar35,auVar44);
              auVar28._0_4_ = local_13d8._0_4_ * auVar79._0_4_;
              auVar28._4_4_ = local_13d8._4_4_ * auVar79._4_4_;
              auVar28._8_4_ = local_13d8._8_4_ * auVar79._8_4_;
              auVar28._12_4_ = local_13d8._12_4_ * auVar79._12_4_;
              local_1388 = vminps_avx(auVar28,auVar44);
              uVar12 = (ulong)(uVar11 & 0xff);
              local_1518 = local_1500->scene;
              lVar14 = lVar14 + uVar22;
              pSVar19 = local_1500->scene;
              do {
                uVar13 = 0;
                if (uVar12 != 0) {
                  for (; (uVar12 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                  }
                }
                local_1460 = *(uint *)(lVar14 + 0x90 + uVar13 * 4);
                pGVar3 = (pSVar19->geometries).items[local_1460].ptr;
                if ((pGVar3->mask & ray->mask) == 0) {
                  uVar12 = uVar12 ^ 1L << (uVar13 & 0x3f);
                }
                else {
                  local_1538._0_8_ = uVar13;
                  local_1528._0_8_ = uVar12;
                  if ((local_1500->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00e57520;
                  local_14e8._0_8_ = local_1500->args;
                  local_14b8._0_8_ = lVar16;
                  local_14a8._0_8_ = uVar18;
                  local_1498._0_8_ = puVar17;
                  local_1448.context = local_1500->user;
                  local_1478 = *(undefined4 *)(local_1368 + uVar13 * 4);
                  local_1474 = *(undefined4 *)(local_1358 + uVar13 * 4);
                  local_1470 = *(undefined4 *)(local_1348 + uVar13 * 4);
                  local_146c = *(undefined4 *)(local_1398 + uVar13 * 4);
                  local_1468 = *(undefined4 *)(local_1388 + uVar13 * 4);
                  local_1464 = *(undefined4 *)(local_1558 + 0xa0 + uVar13 * 4);
                  local_145c = (local_1448.context)->instID[0];
                  local_1458 = (local_1448.context)->instPrimID[0];
                  local_14c8._0_4_ = ray->tfar;
                  ray->tfar = *(float *)(local_1378 + uVar13 * 4);
                  local_153c = -1;
                  local_1448.valid = &local_153c;
                  local_1448.geometryUserPtr = pGVar3->userPtr;
                  local_14f8._0_8_ = ray;
                  local_1448.hit = (RTCHitN *)&local_1478;
                  local_1448.N = 1;
                  local_14d8._0_8_ = pGVar3;
                  local_1448.ray = (RTCRayN *)ray;
                  if ((pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar3->occlusionFilterN)(&local_1448), *local_1448.valid != 0)) {
                    ray = (Ray *)local_14f8._0_8_;
                    if ((*(code **)(local_14e8._0_8_ + 0x10) == (code *)0x0) ||
                       (((*(byte *)local_14e8._0_8_ & 2) == 0 &&
                        ((*(byte *)(local_14d8._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_00e57520:
                      ray->tfar = -INFINITY;
                      return;
                    }
                    (**(code **)(local_14e8._0_8_ + 0x10))(&local_1448);
                    ray = (Ray *)local_14f8._0_8_;
                    if (*local_1448.valid != 0) goto LAB_00e57520;
                  }
                  *(undefined4 *)(local_14f8._0_8_ + 0x20) = local_14c8._0_4_;
                  uVar12 = local_1528._0_8_ ^ 1L << (local_1538._0_8_ & 0x3f);
                  ray = (Ray *)local_14f8._0_8_;
                  lVar16 = local_14b8._0_8_;
                  puVar17 = (ulong *)local_1498._0_8_;
                  uVar18 = local_14a8._0_8_;
                }
                lVar14 = local_1558;
                pSVar19 = local_1518;
              } while (uVar12 != 0);
            }
          }
          auVar91 = ZEXT3264(local_11f8);
          auVar101 = ZEXT3264(local_1218);
          auVar107 = ZEXT3264(local_1238);
          auVar109 = ZEXT3264(local_1258);
          auVar113 = ZEXT3264(local_1278);
          auVar116 = ZEXT3264(local_1298);
          auVar121 = ZEXT3264(local_12b8);
          auVar65 = ZEXT3264(local_12d8);
          auVar56 = ZEXT3264(local_12f8);
          auVar80 = ZEXT3264(local_1318);
          auVar84 = ZEXT3264(local_1338);
        }
        goto LAB_00e56c76;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }